

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMappingValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)606>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  CategoricalMapping *pCVar5;
  GLMRegressor *pGVar6;
  LogMessage *pLVar7;
  undefined8 *puVar8;
  SequenceFeatureType *pSVar9;
  Type *pTVar10;
  FeatureType *pFVar11;
  ArrayFeatureType *pAVar12;
  long *plVar13;
  long *plVar14;
  size_type *psVar15;
  uint32 uVar16;
  ModelDescription *from;
  _Alloc_hider _Var17;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  Result result;
  ModelDescription interface;
  int local_1a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a0;
  _Alloc_hider local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  string local_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  undefined1 local_148 [40];
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [56];
  undefined1 local_a8 [24];
  int local_90;
  Rep *local_88;
  RepeatedPtrFieldBase local_80 [3];
  
  from = format->description_;
  if (from == (ModelDescription *)0x0) {
    from = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  Specification::ModelDescription::ModelDescription((ModelDescription *)local_a8,from);
  Result::Result((Result *)&local_1a0);
  validateModelDescription
            ((Result *)local_158,(ModelDescription *)local_a8,format->specificationversion_);
  local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158;
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_150);
  pcVar2 = local_148 + 8;
  if (local_150._M_p != pcVar2) {
    operator_delete(local_150._M_p,local_148._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_1a0);
  if (bVar4) {
    if (format->_oneof_case_[0] == 0x25e) {
      pCVar5 = (CategoricalMapping *)(format->Type_).onehotencoder_;
    }
    else {
      pCVar5 = Specification::CategoricalMapping::default_instance();
    }
    uVar16 = pCVar5->_oneof_case_[0];
    if (format->_oneof_case_[0] == 0x25e) {
      pGVar6 = (format->Type_).glmregressor_;
    }
    else {
      pGVar6 = (GLMRegressor *)Specification::CategoricalMapping::default_instance();
    }
    if (uVar16 == 0) {
      local_158 = (undefined1  [8])local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"Mapping not set.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
LAB_004e80a4:
      _Var17._M_p = (pointer)local_158;
      if (local_158 == (undefined1  [8])local_148) goto LAB_004e85a1;
LAB_004e80b7:
      operator_delete(_Var17._M_p,local_148._0_8_ + 1);
      goto LAB_004e85a1;
    }
    iVar3 = (pGVar6->offset_).current_size_;
    if (uVar16 == 1) {
      if (iVar3 == 0x65) {
        local_158 = (undefined1  [8])local_148;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,
                   "ValueOnUnknown set to string value while mapping produces int64.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
        goto LAB_004e80a4;
      }
      uVar16 = 3;
      local_1a4 = 1;
    }
    else if (uVar16 == 2) {
      if (iVar3 == 0x66) {
        local_158 = (undefined1  [8])local_148;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_158,
                   "ValueOnUnknown set to Int64 value while mapping produces string.","");
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_158);
        goto LAB_004e80a4;
      }
      uVar16 = 1;
      local_1a4 = 3;
    }
    local_178._M_dataplus._M_p._4_4_ = 7;
    local_178._M_dataplus._M_p._0_4_ = uVar16;
    __l._M_len = 2;
    __l._M_array = (iterator)&local_178;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_e0,__l,(allocator_type *)&local_120);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_158,(CoreML *)(local_a8 + 0x10),
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_e0,
               in_R8);
    local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158;
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_150);
    if (local_150._M_p != pcVar2) {
      operator_delete(local_150._M_p,local_148._8_8_ + 1);
    }
    if ((pointer)local_e0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_e0._0_8_,local_e0._16_8_ - local_e0._0_8_);
    }
    bVar4 = Result::good((Result *)&local_1a0);
    if (bVar4) {
      local_178._M_dataplus._M_p._4_4_ = 7;
      local_178._M_dataplus._M_p._0_4_ = local_1a4;
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)&local_178;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_e0,__l_00,(allocator_type *)&local_120);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_158,(CoreML *)local_80,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_e0,
                 in_R8);
      local_1a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158;
      std::__cxx11::string::operator=((string *)&local_198,(string *)&local_150);
      if (local_150._M_p != pcVar2) {
        operator_delete(local_150._M_p,local_148._8_8_ + 1);
      }
      if ((pointer)local_e0._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_e0._0_8_,local_e0._16_8_ - local_e0._0_8_);
      }
      bVar4 = Result::good((Result *)&local_1a0);
      if (bVar4) {
        if (local_90 < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_e0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar7 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_e0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_158,pLVar7);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_e0);
        }
        puVar8 = *(undefined8 **)((long)local_88->elements[0] + 0x20);
        if (puVar8 == (undefined8 *)0x0) {
          puVar8 = &Specification::_FeatureType_default_instance_;
        }
        if (*(int *)((long)puVar8 + 0x24) == 7) {
          if (local_90 < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      ((LogMessage *)local_158,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x5ca);
            pLVar7 = google::protobuf::internal::LogMessage::operator<<
                               ((LogMessage *)local_158,"CHECK failed: (index) < (current_size_): ")
            ;
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_178,pLVar7);
            google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_158);
          }
          puVar8 = *(undefined8 **)((long)local_88->elements[0] + 0x20);
          if (puVar8 == (undefined8 *)0x0) {
            puVar8 = &Specification::_FeatureType_default_instance_;
          }
          if (*(int *)((long)puVar8 + 0x24) == 7) {
            pSVar9 = (SequenceFeatureType *)puVar8[3];
          }
          else {
            pSVar9 = Specification::SequenceFeatureType::default_instance();
          }
          if (pSVar9->_oneof_case_[0] == uVar16) {
            pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_80,0);
            pFVar11 = pTVar10->type_;
            if (pFVar11 == (FeatureType *)0x0) {
              pFVar11 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar11->_oneof_case_[0] != 7) {
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_178,
                         "Output of a sequence categorical mapping must be a sequence","");
              Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                             &local_178);
              local_148._0_8_ = local_178.field_2._M_allocated_capacity;
              _Var17._M_p = local_178._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p == &local_178.field_2) goto LAB_004e85a1;
              goto LAB_004e80b7;
            }
            pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                (local_80,0);
            pFVar11 = pTVar10->type_;
            if (pFVar11 == (FeatureType *)0x0) {
              pFVar11 = (FeatureType *)&Specification::_FeatureType_default_instance_;
            }
            if (pFVar11->_oneof_case_[0] == 7) {
              pAVar12 = (pFVar11->Type_).multiarraytype_;
            }
            else {
              pAVar12 = (ArrayFeatureType *)Specification::SequenceFeatureType::default_instance();
            }
            if (pAVar12->datatype_ == local_1a4) goto LAB_004e8553;
            local_100[0] = &local_f0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_100,"Output sequence type does not match input type ","");
            puVar8 = (undefined8 *)std::__cxx11::string::append((char *)local_100);
            local_120 = &local_110;
            plVar13 = puVar8 + 2;
            if ((long *)*puVar8 == plVar13) {
              local_110 = *plVar13;
              lStack_108 = puVar8[3];
            }
            else {
              local_110 = *plVar13;
              local_120 = (long *)*puVar8;
            }
            local_118 = puVar8[1];
            *puVar8 = plVar13;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_120);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            psVar15 = (size_type *)(plVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_178.field_2._M_allocated_capacity = *psVar15;
              local_178.field_2._8_8_ = plVar13[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *psVar15;
              local_178._M_dataplus._M_p = (pointer)*plVar13;
            }
            local_178._M_string_length = plVar13[1];
            *plVar13 = (long)psVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_178
                          );
          }
          else {
            local_100[0] = &local_f0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_100,"Input sequence type does not match input type ","");
            plVar13 = (long *)std::__cxx11::string::append((char *)local_100);
            local_120 = &local_110;
            plVar14 = plVar13 + 2;
            if ((long *)*plVar13 == plVar14) {
              local_110 = *plVar14;
              lStack_108 = plVar13[3];
            }
            else {
              local_110 = *plVar14;
              local_120 = (long *)*plVar13;
            }
            local_118 = plVar13[1];
            *plVar13 = (long)plVar14;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            plVar13 = (long *)std::__cxx11::string::append((char *)&local_120);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            psVar15 = (size_type *)(plVar13 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_178.field_2._M_allocated_capacity = *psVar15;
              local_178.field_2._8_8_ = plVar13[3];
            }
            else {
              local_178.field_2._M_allocated_capacity = *psVar15;
              local_178._M_dataplus._M_p = (pointer)*plVar13;
            }
            local_178._M_string_length = plVar13[1];
            *plVar13 = (long)psVar15;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_178
                          );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          local_148._0_8_ = local_f0._M_allocated_capacity;
          _Var17._M_p = (pointer)local_100[0];
          if (local_100[0] == &local_f0) goto LAB_004e85a1;
          goto LAB_004e80b7;
        }
      }
    }
  }
LAB_004e8553:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_1a0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p == &local_188) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_188._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_198._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_190;
  local_190 = 0;
  local_188._M_local_buf[0] = '\0';
  local_198._M_p = (pointer)&local_188;
LAB_004e85a1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_p != &local_188) {
    operator_delete(local_198._M_p,
                    CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) + 1);
  }
  Specification::ModelDescription::~ModelDescription((ModelDescription *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_categoricalMapping>(const Specification::Model& format) {
        auto interface = format.description();

        Result result;

        // Validate its a MLModel type.
        result = validateModelDescription(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }
        
        auto mapping_type = format.categoricalmapping().MappingType_case();
        auto defval_type = format.categoricalmapping().ValueOnUnknown_case();
        Specification::FeatureType::TypeCase requiredInputType;
        Specification::FeatureType::TypeCase requiredOutputType;
        Specification::SequenceFeatureType::TypeCase requiredInputSeqType;
        Specification::SequenceFeatureType::TypeCase requiredOutputSeqType;

        switch(mapping_type) {
            case Specification::CategoricalMapping::MappingTypeCase::kStringToInt64Map:
                
                if(defval_type == Specification::CategoricalMapping::ValueOnUnknownCase::kStrValue) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "ValueOnUnknown set to string value while mapping produces int64.");
                }
                requiredInputType = Specification::FeatureType::kStringType;
                requiredOutputType = Specification::FeatureType::kInt64Type;
                requiredInputSeqType = Specification::SequenceFeatureType::kStringType;
                requiredOutputSeqType = Specification::SequenceFeatureType::kInt64Type;
                
                break;
                
            case Specification::CategoricalMapping::MappingTypeCase::kInt64ToStringMap:
                if(defval_type == Specification::CategoricalMapping::ValueOnUnknownCase::kInt64Value) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "ValueOnUnknown set to Int64 value while mapping produces string.");
                }
                requiredOutputType = Specification::FeatureType::kStringType;
                requiredInputType = Specification::FeatureType::kInt64Type;
                requiredOutputSeqType = Specification::SequenceFeatureType::kStringType;
                requiredInputSeqType = Specification::SequenceFeatureType::kInt64Type;
                
                break;
                
            case Specification::CategoricalMapping::MappingTypeCase::MAPPINGTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              "Mapping not set.");
        }

        // Validate the inputs
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {requiredInputType, Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the outputs
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {requiredOutputType, Specification::FeatureType::kSequenceType});
        if (!result.good()) {
            return result;
        }

        // Check if the input was a sequence
        if (interface.input(0).type().Type_case() == Specification::FeatureType::kSequenceType) {

            // Make sure its the correct input type
            if (interface.input(0).type().sequencetype().Type_case() != requiredInputSeqType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              std::string("Input sequence type does not match input type ") +
                              MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(requiredInputType)) +
                              "of categorical mapping.");
            }

            // Make sure the outupt is a sequence as well
            if (interface.output(0).type().Type_case() != Specification::FeatureType::kSequenceType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              "Output of a sequence categorical mapping must be a sequence");
            }

            // Make sure the otuput is the correct type
            if (interface.output(0).type().sequencetype().Type_case() != requiredOutputSeqType) {
                return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                              std::string("Output sequence type does not match input type ") +
                              MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(requiredOutputType)) +
                              "of categorical mapping.");
            }
        }


        // Validate the parameters
        return result;
    }